

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_light.cpp
# Opt level: O2

Vector2D __thiscall
CGL::SceneObjects::EnvironmentLight::xy_to_theta_phi(EnvironmentLight *this,Vector2D *xy)

{
  double *in_RDX;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Vector2D VVar4;
  
  dVar1 = *in_RDX / (double)*(uint *)xy->y;
  auVar3._0_8_ = in_RDX[1] / (double)((uint *)xy->y)[2];
  auVar3._8_8_ = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = dVar1 + dVar1;
  auVar2 = vunpcklpd_avx(auVar3,auVar2);
  VVar4.x = (_func_int **)(auVar2._0_8_ * 3.141592653589793);
  (this->super_SceneLight)._vptr_SceneLight = VVar4.x;
  this->envMap = (HDRImageBuffer *)(auVar2._8_8_ * 3.141592653589793);
  VVar4.y = 3.141592653589793;
  return VVar4;
}

Assistant:

Vector2D EnvironmentLight::xy_to_theta_phi(const Vector2D& xy) const {
    uint32_t w = envMap->w, h = envMap->h;
    double x = xy.x;
    double y = xy.y;
    double phi = x / w * 2.0 * PI;
    double theta = y / h * PI;
    return Vector2D(theta, phi);
  }